

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall
nuraft::asio_rpc_client::handle_handshake
          (asio_rpc_client *this,ptr<req_msg> *req,rpc_handler *when_done,uint64_t send_timeout_ms,
          error_code *err)

{
  int32 iVar1;
  uint uVar2;
  int args_3;
  element_type *peVar3;
  pointer pcVar4;
  pointer pcVar5;
  char *args_1;
  char *args_2;
  int iVar6;
  ptr<resp_msg> resp;
  ptr<rpc_exception> except;
  char *local_d8 [4];
  ptr<asio_rpc_client> self;
  undefined1 local_a8 [8];
  strfmt<100> local_a0;
  
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  if (err->_M_value == 0) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (3 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)(local_a8 + 8),"handshake with %s:%s succeeded (as a client)",
                   (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x550,local_a8 + 8);
        std::__cxx11::string::~string((string *)(local_a8 + 8));
      }
    }
    LOCK();
    (this->ssl_ready_)._M_base._M_i = true;
    UNLOCK();
    (*(this->super_rpc_client)._vptr_rpc_client[2])(this,req,when_done,send_timeout_ms);
  }
  else {
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
      if (1 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar1 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_msg_base).dst_;
        pcVar4 = (this->host_)._M_dataplus._M_p;
        pcVar5 = (this->port_)._M_dataplus._M_p;
        uVar2 = err->_M_value;
        (**(code **)(*(long *)err->_M_cat + 0x20))(local_d8,err->_M_cat,uVar2);
        msg_if_given_abi_cxx11_
                  ((string *)(local_a8 + 8),"failed SSL handshake with peer %d, %s:%s, error %d, %s"
                   ,iVar1,pcVar4,pcVar5,(ulong)uVar2,local_d8[0]);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x558,local_a8 + 8);
        std::__cxx11::string::~string((string *)(local_a8 + 8));
        std::__cxx11::string::~string((string *)local_d8);
      }
    }
    resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.fmt_ = "failed SSL handshake with peer %d, %s:%s, error %d, %s";
    iVar6 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_msg_base).dst_;
    args_1 = (this->host_)._M_dataplus._M_p;
    args_2 = (this->port_)._M_dataplus._M_p;
    args_3 = err->_M_value;
    (**(code **)(*(long *)err->_M_cat + 0x20))(local_d8,err->_M_cat,args_3);
    local_a8 = (undefined1  [8])
               strfmt<100>::fmt<int,char_const*,char_const*,int,char_const*>
                         ((strfmt<100> *)(local_a8 + 8),iVar6,args_1,args_2,args_3,local_d8[0]);
    std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)&except,(shared_ptr<nuraft::req_msg> *)local_a8);
    std::__cxx11::string::~string((string *)local_d8);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()(when_done,&resp,&except);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&resp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void handle_handshake(ptr<req_msg>& req,
                          rpc_handler& when_done,
                          uint64_t send_timeout_ms,
                          const ERROR_CODE& err)
    {
        ptr<asio_rpc_client> self = this->shared_from_this();

        if (!err) {
            p_in( "handshake with %s:%s succeeded (as a client)",
                  host_.c_str(), port_.c_str() );
            ssl_ready_ = true;
            this->send(req, when_done, send_timeout_ms);

        } else {
            abandoned_ = true;
            p_er( "failed SSL handshake with peer %d, %s:%s, error %d, %s",
                  req->get_dst(), host_.c_str(), port_.c_str(), err.value(),
                  err.message().c_str() );

            // Immediately stop.
            ptr<resp_msg> resp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt("failed SSL handshake with peer %d, %s:%s, "
                            "error %d, %s")
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            when_done(resp, except);
        }
    }